

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O1

void __thiscall
cubeb_resampler_speex_one_way<short>::cubeb_resampler_speex_one_way
          (cubeb_resampler_speex_one_way<short> *this,uint32_t channels,uint32_t source_rate,
          uint32_t target_rate,int quality)

{
  uint uVar1;
  SpeexResamplerState *st;
  uint32_t output_frame_count;
  uint32_t input_frame_count;
  int r;
  short output_buffer [8192];
  short input_buffer [8192];
  uint local_8034;
  uint local_8030;
  int local_802c;
  short local_8028 [8192];
  short local_4028 [8196];
  
  (this->super_processor).channels = channels;
  this->_vptr_cubeb_resampler_speex_one_way =
       (_func_int **)&PTR__cubeb_resampler_speex_one_way_001490f8;
  this->resampling_ratio = (float)source_rate / (float)target_rate;
  this->source_rate = source_rate;
  (this->resampling_in_buffer).data_ = (short *)0x0;
  (this->resampling_in_buffer).capacity_ = 0;
  (this->resampling_in_buffer).length_ = 0;
  (this->resampling_out_buffer).data_ = (short *)0x0;
  (this->resampling_out_buffer).capacity_ = 0;
  (this->resampling_out_buffer).length_ = 0;
  this->additional_latency = 0;
  this->leftover_samples = 0;
  st = speex_resampler_init(channels,source_rate,target_rate,quality,&local_802c);
  this->speex_resampler = st;
  uVar1 = speex_resampler_get_input_latency(st);
  memset(local_4028,0,0x4000);
  memset(local_8028,0,0x4000);
  local_8034 = 0x2000;
  local_8030 = uVar1;
  speex_resampler_process_interleaved_int
            (this->speex_resampler,local_4028,&local_8030,local_8028,&local_8034);
  return;
}

Assistant:

cubeb_resampler_speex_one_way(uint32_t channels, uint32_t source_rate,
                                uint32_t target_rate, int quality)
      : processor(channels),
        resampling_ratio(static_cast<float>(source_rate) / target_rate),
        source_rate(source_rate), additional_latency(0), leftover_samples(0)
  {
    int r;
    speex_resampler =
        speex_resampler_init(channels, source_rate, target_rate, quality, &r);
    assert(r == RESAMPLER_ERR_SUCCESS && "resampler allocation failure");

    uint32_t input_latency = speex_resampler_get_input_latency(speex_resampler);
    const size_t LATENCY_SAMPLES = 8192;
    T input_buffer[LATENCY_SAMPLES] = {};
    T output_buffer[LATENCY_SAMPLES] = {};
    uint32_t input_frame_count = input_latency;
    uint32_t output_frame_count = LATENCY_SAMPLES;
    assert(input_latency * channels <= LATENCY_SAMPLES);
    speex_resample(input_buffer, &input_frame_count, output_buffer,
                   &output_frame_count);
  }